

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedObjects.hpp
# Opt level: O0

future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> __thiscall
gmlc::concurrency::
DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
getFuture(DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,int index)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> fVar1;
  lock_guard<std::mutex> lock;
  promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> V;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *fut;
  promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff88;
  element_type *this_00;
  promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *__rhs;
  promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 uVar2;
  byte bVar3;
  element_type *in_stack_ffffffffffffffd0;
  
  __rhs = (promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&stack0xffffffffffffffd0;
  this_00 = in_RDI;
  std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  promise(in_stack_ffffffffffffffb0);
  uVar2 = 0;
  std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  get_future(in_stack_ffffffffffffff88);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,(mutex_type *)in_stack_ffffffffffffff88);
  std::
  map<int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::operator[]((map<int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)in_stack_ffffffffffffffd0,(key_type *)CONCAT17(uVar2,in_stack_ffffffffffffffc8));
  std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator=(in_stack_ffffffffffffffb0,__rhs);
  bVar3 = 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x497c05);
  if ((bVar3 & 1) == 0) {
    std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~future((future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x497c52);
  }
  std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~promise((promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)this_00);
  fVar1.
  super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  fVar1.
  super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>)
         fVar1.
         super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::future<X> getFuture(int index)
    {
        auto V = std::promise<X>();
        auto fut = V.get_future();
        std::lock_guard<std::mutex> lock(promiseLock);
        promiseByInteger[index] = std::move(V);
        return fut;
    }